

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::alloc
          (array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this,int new_len)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CScaledGlyph *p;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  CScaledGlyph *pCVar12;
  ulong uVar13;
  ulong uVar14;
  
  this->list_size = new_len;
  pCVar12 = allocator_default<CScaledGlyph>::alloc_array(new_len);
  uVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar3 = this->num_elements;
  }
  uVar14 = 0;
  uVar13 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar13 = uVar14;
  }
  for (; p = this->list, uVar13 * 0x40 != uVar14; uVar14 = uVar14 + 0x40) {
    puVar1 = (undefined8 *)((long)&p->m_pGlyph + uVar14);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    puVar1 = (undefined8 *)((long)&p->m_Line + uVar14);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(p->m_TextColor).field_1 + uVar14);
    uVar8 = *puVar1;
    uVar9 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(p->m_SecondaryColor).field_0 + uVar14);
    uVar10 = puVar1[1];
    puVar2 = (undefined8 *)((long)&(pCVar12->m_SecondaryColor).field_0 + uVar14);
    *puVar2 = *puVar1;
    puVar2[1] = uVar10;
    puVar1 = (undefined8 *)((long)&(pCVar12->m_TextColor).field_1 + uVar14);
    *puVar1 = uVar8;
    puVar1[1] = uVar9;
    puVar1 = (undefined8 *)((long)&pCVar12->m_Line + uVar14);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    puVar1 = (undefined8 *)((long)&pCVar12->m_pGlyph + uVar14);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
  }
  allocator_default<CScaledGlyph>::free_array(p);
  iVar11 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar11 = this->num_elements;
  }
  this->num_elements = iVar11;
  this->list = pCVar12;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}